

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O3

void __thiscall CLayerTiles::~CLayerTiles(CLayerTiles *this)

{
  (this->super_CLayer)._vptr_CLayer = (_func_int **)&PTR__CLayerTiles_002134c0;
  if (this->m_pTiles != (CTile *)0x0) {
    operator_delete__(this->m_pTiles);
  }
  this->m_pTiles = (CTile *)0x0;
  if (this->m_pSaveTiles != (CTile *)0x0) {
    operator_delete__(this->m_pSaveTiles);
  }
  this->m_pSaveTiles = (CTile *)0x0;
  this->m_SaveTilesSize = 0;
  return;
}

Assistant:

CLayerTiles::~CLayerTiles()
{
	delete [] m_pTiles;
	m_pTiles = 0;
	delete [] m_pSaveTiles;
	m_pSaveTiles = 0;
	m_SaveTilesSize = 0;
}